

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::fan_reduce<long>(Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width,Omega_h_Op op)

{
  int *piVar1;
  Alloc *pAVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  Alloc *this_00;
  Read<signed_char> RVar4;
  LOs local_78;
  LOs local_68;
  LOs local_58;
  Read<signed_char> local_48;
  Read<signed_char> local_38;
  Read<signed_char> local_28;
  
  if (op == OMEGA_H_SUM) {
    local_78.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_48.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
    RVar4 = fan_reduce_tmpl<Omega_h::SumFunctor<long>>(this,&local_78,&local_48,width);
    pAVar2 = local_48.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_78.write_.shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX_00;
        this_00 = local_78.write_.shared_alloc_.alloc;
      }
    }
  }
  else if (op == OMEGA_H_MAX) {
    local_68.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_38.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38.write_.shared_alloc_.alloc =
             (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_38.write_.shared_alloc_.alloc)->use_count =
             (local_38.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_38.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
    RVar4 = fan_reduce_tmpl<Omega_h::MaxFunctor<long>>(this,&local_68,&local_38,width);
    pAVar2 = local_38.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX;
        this_00 = local_68.write_.shared_alloc_.alloc;
      }
    }
  }
  else {
    if (op != OMEGA_H_MIN) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
           ,0x144);
    }
    local_58.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_28.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_28.write_.shared_alloc_.alloc =
             (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_28.write_.shared_alloc_.alloc)->use_count =
             (local_28.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_28.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
    RVar4 = fan_reduce_tmpl<Omega_h::MinFunctor<long>>(this,&local_58,&local_28,width);
    pAVar2 = local_28.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_58.write_.shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_28.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_28.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX_01;
        this_00 = local_58.write_.shared_alloc_.alloc;
      }
    }
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<T> fan_reduce(LOs a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  switch (op) {
    case OMEGA_H_MIN:
      return fan_reduce_tmpl<MinFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_MAX:
      return fan_reduce_tmpl<MaxFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_SUM:
      return fan_reduce_tmpl<SumFunctor<T>>(a2b, b_data, width);
  }
  OMEGA_H_NORETURN(Read<T>());
}